

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  value_type *lhs;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  opt_type o2;
  other_opt_type o1;
  AssertHelper local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  
  o1.storage_ = -1;
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>,_true,_true>(&o2,&o1)
  ;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = o1.storage_ == -1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x189ce8,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1d7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = o1.storage_ == -1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"o1.has_value()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1d8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::value(&o1);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1d9,
             "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  lhs = &(this->
         super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
         ).value_2;
  gtest_ar_.success_ =
       (bool)mp::opt<signed_char,mp::opt_null_value_policy<signed_char,(signed_char)-1>>::
             value_or<signed_char_const&>
                       ((opt<signed_char,mp::opt_null_value_policy<signed_char,(signed_char)_1>> *)
                        &o1,&(this->
                             super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
                             ).other_value_2);
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)&gtest_ar,"this->value_2","o1.value_or(this->other_value_2)",lhs,
             &gtest_ar_.success_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar1 = o2.storage_ == '\a';
  gtest_ar_.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x1896ab,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1db,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (o2.storage_ != '\a') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"o2.has_value()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1dc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value(&o2);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1dd,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  gtest_ar_.success_ =
       (bool)mp::
             opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
             ::value_or<(anonymous_namespace)::weekday_const&>
                       ((opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
                         *)&o2,lhs);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&gtest_ar,"this->value_2","o2.value_or(this->value_2)",lhs,
             (weekday *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{o1};
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}